

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_rejects_table.cpp
# Opt level: O2

void __thiscall
duckdb::CSVRejectsTable::InitializeTable
          (CSVRejectsTable *this,ClientContext *context,ReadCSVData *data)

{
  Catalog *this_00;
  pointer pCVar1;
  type info;
  pointer pCVar2;
  allocator local_1991;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_1990;
  _Head_base<0UL,_duckdb::CreateTypeInfo_*,_false> local_1988;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_1980;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_1978;
  LogicalType enum_type;
  LogicalType local_1930;
  LogicalType local_1918;
  LogicalType local_1900;
  LogicalType local_18e8;
  LogicalType local_18d0;
  LogicalType local_18b8;
  LogicalType local_18a0;
  LogicalType local_1888;
  LogicalType local_1870;
  LogicalType local_1858;
  LogicalType local_1840;
  LogicalType local_1828;
  LogicalType local_1810;
  LogicalType local_17f8;
  LogicalType local_17e0;
  LogicalType local_17c8;
  LogicalType local_17b0;
  LogicalType local_1798;
  LogicalType local_1780;
  LogicalType local_1768;
  LogicalType local_1750;
  LogicalType local_1738;
  LogicalType local_1720;
  LogicalType local_1708;
  string enum_name;
  Vector order_errors;
  string local_1668;
  string local_1648;
  string local_1628;
  string local_1608;
  string local_15e8;
  string local_15c8;
  string local_15a8;
  string local_1588;
  string local_1568;
  string local_1548;
  string local_1528;
  string local_1508;
  string local_14e8;
  string local_14c8;
  string local_14a8;
  string local_1488;
  string local_1468;
  string local_1448;
  string local_1428;
  string local_1408;
  string local_13e8;
  string local_13c8;
  string local_13a8;
  ColumnDefinition local_1388;
  ColumnDefinition local_12b0;
  ColumnDefinition local_11d8;
  ColumnDefinition local_1100;
  ColumnDefinition local_1028;
  ColumnDefinition local_f50;
  ColumnDefinition local_e78;
  ColumnDefinition local_da0;
  ColumnDefinition local_cc8;
  ColumnDefinition local_bf0;
  ColumnDefinition local_b18;
  ColumnDefinition local_a40;
  ColumnDefinition local_968;
  ColumnDefinition local_890;
  ColumnDefinition local_7b8;
  ColumnDefinition local_6e0;
  ColumnDefinition local_608;
  ColumnDefinition local_530;
  ColumnDefinition local_458;
  ColumnDefinition local_380;
  ColumnDefinition local_2a8;
  ColumnDefinition local_1d0;
  ColumnDefinition local_f8;
  
  ::std::__cxx11::string::string((string *)&order_errors,"temp",(allocator *)&enum_type);
  this_00 = Catalog::GetCatalog(context,(string *)&order_errors);
  ::std::__cxx11::string::~string((string *)&order_errors);
  ::std::__cxx11::string::string((string *)&enum_name,"CSV_ERROR_TYPE",(allocator *)&order_errors);
  LogicalType::LogicalType(&local_1708,VARCHAR);
  Vector::Vector(&order_errors,&local_1708,7);
  LogicalType::~LogicalType(&local_1708);
  Value::Value((Value *)&enum_type,"CAST");
  Vector::SetValue(&order_errors,0,(Value *)&enum_type);
  Value::~Value((Value *)&enum_type);
  Value::Value((Value *)&enum_type,"MISSING COLUMNS");
  Vector::SetValue(&order_errors,1,(Value *)&enum_type);
  Value::~Value((Value *)&enum_type);
  Value::Value((Value *)&enum_type,"TOO MANY COLUMNS");
  Vector::SetValue(&order_errors,2,(Value *)&enum_type);
  Value::~Value((Value *)&enum_type);
  Value::Value((Value *)&enum_type,"UNQUOTED VALUE");
  Vector::SetValue(&order_errors,3,(Value *)&enum_type);
  Value::~Value((Value *)&enum_type);
  Value::Value((Value *)&enum_type,"LINE SIZE OVER MAXIMUM");
  Vector::SetValue(&order_errors,4,(Value *)&enum_type);
  Value::~Value((Value *)&enum_type);
  Value::Value((Value *)&enum_type,"INVALID ENCODING");
  Vector::SetValue(&order_errors,5,(Value *)&enum_type);
  Value::~Value((Value *)&enum_type);
  Value::Value((Value *)&enum_type,"INVALID STATE");
  Vector::SetValue(&order_errors,6,(Value *)&enum_type);
  Value::~Value((Value *)&enum_type);
  LogicalType::ENUM(&enum_type,(string *)&enum_name,&order_errors,7);
  make_uniq<duckdb::CreateTypeInfo,std::__cxx11::string&,duckdb::LogicalType&>
            ((duckdb *)&local_1988,&enum_name,&enum_type);
  pCVar1 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                       *)&local_1988);
  (pCVar1->super_CreateInfo).temporary = true;
  pCVar1 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                       *)&local_1988);
  (pCVar1->super_CreateInfo).on_conflict = IGNORE_ON_CONFLICT;
  info = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
         operator*((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                    *)&local_1988);
  Catalog::CreateType(this_00,context,info);
  make_uniq<duckdb::CreateTableInfo,char_const(&)[5],char_const(&)[5],std::__cxx11::string&>
            ((duckdb *)&local_1990,(char (*) [5])"temp",(char (*) [5])0x210196b,&this->scan_table);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  (pCVar2->super_CreateInfo).temporary = true;
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  (pCVar2->super_CreateInfo).on_conflict = IGNORE_ON_CONFLICT;
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  ::std::__cxx11::string::string((string *)&local_13a8,"scan_id",&local_1991);
  LogicalType::LogicalType(&local_1720,UBIGINT);
  ColumnDefinition::ColumnDefinition(&local_f8,&local_13a8,&local_1720);
  ColumnList::AddColumn(&pCVar2->columns,&local_f8);
  ColumnDefinition::~ColumnDefinition(&local_f8);
  LogicalType::~LogicalType(&local_1720);
  ::std::__cxx11::string::~string((string *)&local_13a8);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  ::std::__cxx11::string::string((string *)&local_13c8,"file_id",&local_1991);
  LogicalType::LogicalType(&local_1738,UBIGINT);
  ColumnDefinition::ColumnDefinition(&local_1d0,&local_13c8,&local_1738);
  ColumnList::AddColumn(&pCVar2->columns,&local_1d0);
  ColumnDefinition::~ColumnDefinition(&local_1d0);
  LogicalType::~LogicalType(&local_1738);
  ::std::__cxx11::string::~string((string *)&local_13c8);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  ::std::__cxx11::string::string((string *)&local_13e8,"file_path",&local_1991);
  LogicalType::LogicalType(&local_1750,VARCHAR);
  ColumnDefinition::ColumnDefinition(&local_2a8,&local_13e8,&local_1750);
  ColumnList::AddColumn(&pCVar2->columns,&local_2a8);
  ColumnDefinition::~ColumnDefinition(&local_2a8);
  LogicalType::~LogicalType(&local_1750);
  ::std::__cxx11::string::~string((string *)&local_13e8);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  ::std::__cxx11::string::string((string *)&local_1408,"delimiter",&local_1991);
  LogicalType::LogicalType(&local_1768,VARCHAR);
  ColumnDefinition::ColumnDefinition(&local_380,&local_1408,&local_1768);
  ColumnList::AddColumn(&pCVar2->columns,&local_380);
  ColumnDefinition::~ColumnDefinition(&local_380);
  LogicalType::~LogicalType(&local_1768);
  ::std::__cxx11::string::~string((string *)&local_1408);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  ::std::__cxx11::string::string((string *)&local_1428,"quote",&local_1991);
  LogicalType::LogicalType(&local_1780,VARCHAR);
  ColumnDefinition::ColumnDefinition(&local_458,&local_1428,&local_1780);
  ColumnList::AddColumn(&pCVar2->columns,&local_458);
  ColumnDefinition::~ColumnDefinition(&local_458);
  LogicalType::~LogicalType(&local_1780);
  ::std::__cxx11::string::~string((string *)&local_1428);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  ::std::__cxx11::string::string((string *)&local_1448,"escape",&local_1991);
  LogicalType::LogicalType(&local_1798,VARCHAR);
  ColumnDefinition::ColumnDefinition(&local_530,&local_1448,&local_1798);
  ColumnList::AddColumn(&pCVar2->columns,&local_530);
  ColumnDefinition::~ColumnDefinition(&local_530);
  LogicalType::~LogicalType(&local_1798);
  ::std::__cxx11::string::~string((string *)&local_1448);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  ::std::__cxx11::string::string((string *)&local_1468,"newline_delimiter",&local_1991);
  LogicalType::LogicalType(&local_17b0,VARCHAR);
  ColumnDefinition::ColumnDefinition(&local_608,&local_1468,&local_17b0);
  ColumnList::AddColumn(&pCVar2->columns,&local_608);
  ColumnDefinition::~ColumnDefinition(&local_608);
  LogicalType::~LogicalType(&local_17b0);
  ::std::__cxx11::string::~string((string *)&local_1468);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  ::std::__cxx11::string::string((string *)&local_1488,"skip_rows",&local_1991);
  LogicalType::LogicalType(&local_17c8,UINTEGER);
  ColumnDefinition::ColumnDefinition(&local_6e0,&local_1488,&local_17c8);
  ColumnList::AddColumn(&pCVar2->columns,&local_6e0);
  ColumnDefinition::~ColumnDefinition(&local_6e0);
  LogicalType::~LogicalType(&local_17c8);
  ::std::__cxx11::string::~string((string *)&local_1488);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  ::std::__cxx11::string::string((string *)&local_14a8,"has_header",&local_1991);
  LogicalType::LogicalType(&local_17e0,BOOLEAN);
  ColumnDefinition::ColumnDefinition(&local_7b8,&local_14a8,&local_17e0);
  ColumnList::AddColumn(&pCVar2->columns,&local_7b8);
  ColumnDefinition::~ColumnDefinition(&local_7b8);
  LogicalType::~LogicalType(&local_17e0);
  ::std::__cxx11::string::~string((string *)&local_14a8);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  ::std::__cxx11::string::string((string *)&local_14c8,"columns",&local_1991);
  LogicalType::LogicalType(&local_17f8,VARCHAR);
  ColumnDefinition::ColumnDefinition(&local_890,&local_14c8,&local_17f8);
  ColumnList::AddColumn(&pCVar2->columns,&local_890);
  ColumnDefinition::~ColumnDefinition(&local_890);
  LogicalType::~LogicalType(&local_17f8);
  ::std::__cxx11::string::~string((string *)&local_14c8);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  ::std::__cxx11::string::string((string *)&local_14e8,"date_format",&local_1991);
  LogicalType::LogicalType(&local_1810,VARCHAR);
  ColumnDefinition::ColumnDefinition(&local_968,&local_14e8,&local_1810);
  ColumnList::AddColumn(&pCVar2->columns,&local_968);
  ColumnDefinition::~ColumnDefinition(&local_968);
  LogicalType::~LogicalType(&local_1810);
  ::std::__cxx11::string::~string((string *)&local_14e8);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  ::std::__cxx11::string::string((string *)&local_1508,"timestamp_format",&local_1991);
  LogicalType::LogicalType(&local_1828,VARCHAR);
  ColumnDefinition::ColumnDefinition(&local_a40,&local_1508,&local_1828);
  ColumnList::AddColumn(&pCVar2->columns,&local_a40);
  ColumnDefinition::~ColumnDefinition(&local_a40);
  LogicalType::~LogicalType(&local_1828);
  ::std::__cxx11::string::~string((string *)&local_1508);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  ::std::__cxx11::string::string((string *)&local_1528,"user_arguments",&local_1991);
  LogicalType::LogicalType(&local_1840,VARCHAR);
  ColumnDefinition::ColumnDefinition(&local_b18,&local_1528,&local_1840);
  ColumnList::AddColumn(&pCVar2->columns,&local_b18);
  ColumnDefinition::~ColumnDefinition(&local_b18);
  LogicalType::~LogicalType(&local_1840);
  ::std::__cxx11::string::~string((string *)&local_1528);
  local_1978._M_head_impl = local_1990._M_head_impl;
  local_1990._M_head_impl = (CreateTableInfo *)0x0;
  Catalog::CreateTable
            (this_00,context,
             (unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
              *)&local_1978);
  if (local_1978._M_head_impl != (CreateTableInfo *)0x0) {
    (*((local_1978._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
  }
  local_1978._M_head_impl = (CreateTableInfo *)0x0;
  if (local_1990._M_head_impl != (CreateTableInfo *)0x0) {
    (*((local_1990._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
  }
  make_uniq<duckdb::CreateTableInfo,char_const(&)[5],char_const(&)[5],std::__cxx11::string&>
            ((duckdb *)&local_1990,(char (*) [5])"temp",(char (*) [5])0x210196b,&this->errors_table)
  ;
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  (pCVar2->super_CreateInfo).temporary = true;
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  (pCVar2->super_CreateInfo).on_conflict = IGNORE_ON_CONFLICT;
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  ::std::__cxx11::string::string((string *)&local_1548,"scan_id",&local_1991);
  LogicalType::LogicalType(&local_1858,UBIGINT);
  ColumnDefinition::ColumnDefinition(&local_bf0,&local_1548,&local_1858);
  ColumnList::AddColumn(&pCVar2->columns,&local_bf0);
  ColumnDefinition::~ColumnDefinition(&local_bf0);
  LogicalType::~LogicalType(&local_1858);
  ::std::__cxx11::string::~string((string *)&local_1548);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  ::std::__cxx11::string::string((string *)&local_1568,"file_id",&local_1991);
  LogicalType::LogicalType(&local_1870,UBIGINT);
  ColumnDefinition::ColumnDefinition(&local_cc8,&local_1568,&local_1870);
  ColumnList::AddColumn(&pCVar2->columns,&local_cc8);
  ColumnDefinition::~ColumnDefinition(&local_cc8);
  LogicalType::~LogicalType(&local_1870);
  ::std::__cxx11::string::~string((string *)&local_1568);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  ::std::__cxx11::string::string((string *)&local_1588,"line",&local_1991);
  LogicalType::LogicalType(&local_1888,UBIGINT);
  ColumnDefinition::ColumnDefinition(&local_da0,&local_1588,&local_1888);
  ColumnList::AddColumn(&pCVar2->columns,&local_da0);
  ColumnDefinition::~ColumnDefinition(&local_da0);
  LogicalType::~LogicalType(&local_1888);
  ::std::__cxx11::string::~string((string *)&local_1588);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  ::std::__cxx11::string::string((string *)&local_15a8,"line_byte_position",&local_1991);
  LogicalType::LogicalType(&local_18a0,UBIGINT);
  ColumnDefinition::ColumnDefinition(&local_e78,&local_15a8,&local_18a0);
  ColumnList::AddColumn(&pCVar2->columns,&local_e78);
  ColumnDefinition::~ColumnDefinition(&local_e78);
  LogicalType::~LogicalType(&local_18a0);
  ::std::__cxx11::string::~string((string *)&local_15a8);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  ::std::__cxx11::string::string((string *)&local_15c8,"byte_position",&local_1991);
  LogicalType::LogicalType(&local_18b8,UBIGINT);
  ColumnDefinition::ColumnDefinition(&local_f50,&local_15c8,&local_18b8);
  ColumnList::AddColumn(&pCVar2->columns,&local_f50);
  ColumnDefinition::~ColumnDefinition(&local_f50);
  LogicalType::~LogicalType(&local_18b8);
  ::std::__cxx11::string::~string((string *)&local_15c8);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  ::std::__cxx11::string::string((string *)&local_15e8,"column_idx",&local_1991);
  LogicalType::LogicalType(&local_18d0,UBIGINT);
  ColumnDefinition::ColumnDefinition(&local_1028,&local_15e8,&local_18d0);
  ColumnList::AddColumn(&pCVar2->columns,&local_1028);
  ColumnDefinition::~ColumnDefinition(&local_1028);
  LogicalType::~LogicalType(&local_18d0);
  ::std::__cxx11::string::~string((string *)&local_15e8);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  ::std::__cxx11::string::string((string *)&local_1608,"column_name",&local_1991);
  LogicalType::LogicalType(&local_18e8,VARCHAR);
  ColumnDefinition::ColumnDefinition(&local_1100,&local_1608,&local_18e8);
  ColumnList::AddColumn(&pCVar2->columns,&local_1100);
  ColumnDefinition::~ColumnDefinition(&local_1100);
  LogicalType::~LogicalType(&local_18e8);
  ::std::__cxx11::string::~string((string *)&local_1608);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  ::std::__cxx11::string::string((string *)&local_1628,"error_type",&local_1991);
  LogicalType::LogicalType(&local_1900,&enum_type);
  ColumnDefinition::ColumnDefinition(&local_11d8,&local_1628,&local_1900);
  ColumnList::AddColumn(&pCVar2->columns,&local_11d8);
  ColumnDefinition::~ColumnDefinition(&local_11d8);
  LogicalType::~LogicalType(&local_1900);
  ::std::__cxx11::string::~string((string *)&local_1628);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  ::std::__cxx11::string::string((string *)&local_1648,"csv_line",&local_1991);
  LogicalType::LogicalType(&local_1918,VARCHAR);
  ColumnDefinition::ColumnDefinition(&local_12b0,&local_1648,&local_1918);
  ColumnList::AddColumn(&pCVar2->columns,&local_12b0);
  ColumnDefinition::~ColumnDefinition(&local_12b0);
  LogicalType::~LogicalType(&local_1918);
  ::std::__cxx11::string::~string((string *)&local_1648);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_1990);
  ::std::__cxx11::string::string((string *)&local_1668,"error_message",&local_1991);
  LogicalType::LogicalType(&local_1930,VARCHAR);
  ColumnDefinition::ColumnDefinition(&local_1388,&local_1668,&local_1930);
  ColumnList::AddColumn(&pCVar2->columns,&local_1388);
  ColumnDefinition::~ColumnDefinition(&local_1388);
  LogicalType::~LogicalType(&local_1930);
  ::std::__cxx11::string::~string((string *)&local_1668);
  local_1980._M_head_impl = local_1990._M_head_impl;
  local_1990._M_head_impl = (CreateTableInfo *)0x0;
  Catalog::CreateTable
            (this_00,context,
             (unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
              *)&local_1980);
  if (local_1980._M_head_impl != (CreateTableInfo *)0x0) {
    (*((local_1980._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
  }
  local_1980._M_head_impl = (CreateTableInfo *)0x0;
  if (local_1990._M_head_impl != (CreateTableInfo *)0x0) {
    (*((local_1990._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
  }
  this->count = 0;
  if (local_1988._M_head_impl != (CreateTypeInfo *)0x0) {
    (*((local_1988._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
  }
  LogicalType::~LogicalType(&enum_type);
  Vector::~Vector(&order_errors);
  ::std::__cxx11::string::~string((string *)&enum_name);
  return;
}

Assistant:

void CSVRejectsTable::InitializeTable(ClientContext &context, const ReadCSVData &data) {
	// (Re)Create the temporary rejects table
	auto &catalog = Catalog::GetCatalog(context, TEMP_CATALOG);

	// Create CSV_ERROR_TYPE ENUM
	string enum_name = "CSV_ERROR_TYPE";
	constexpr uint8_t number_of_accepted_errors = 7;
	Vector order_errors(LogicalType::VARCHAR, number_of_accepted_errors);
	order_errors.SetValue(0, "CAST");
	order_errors.SetValue(1, "MISSING COLUMNS");
	order_errors.SetValue(2, "TOO MANY COLUMNS");
	order_errors.SetValue(3, "UNQUOTED VALUE");
	order_errors.SetValue(4, "LINE SIZE OVER MAXIMUM");
	order_errors.SetValue(5, "INVALID ENCODING");
	order_errors.SetValue(6, "INVALID STATE");

	LogicalType enum_type = LogicalType::ENUM(enum_name, order_errors, number_of_accepted_errors);
	auto type_info = make_uniq<CreateTypeInfo>(enum_name, enum_type);
	type_info->temporary = true;
	type_info->on_conflict = OnCreateConflict::IGNORE_ON_CONFLICT;
	catalog.CreateType(context, *type_info);

	// Create Rejects Scans Table
	{
		auto info = make_uniq<CreateTableInfo>(TEMP_CATALOG, DEFAULT_SCHEMA, scan_table);
		info->temporary = true;
		info->on_conflict = OnCreateConflict::IGNORE_ON_CONFLICT;
		// 0. Scan ID
		info->columns.AddColumn(ColumnDefinition("scan_id", LogicalType::UBIGINT));
		// 1. File ID (within the scan)
		info->columns.AddColumn(ColumnDefinition("file_id", LogicalType::UBIGINT));
		// 2. File Path
		info->columns.AddColumn(ColumnDefinition("file_path", LogicalType::VARCHAR));
		// 3. Delimiter
		info->columns.AddColumn(ColumnDefinition("delimiter", LogicalType::VARCHAR));
		// 4. Quote
		info->columns.AddColumn(ColumnDefinition("quote", LogicalType::VARCHAR));
		// 5. Escape
		info->columns.AddColumn(ColumnDefinition("escape", LogicalType::VARCHAR));
		// 6. NewLine Delimiter
		info->columns.AddColumn(ColumnDefinition("newline_delimiter", LogicalType::VARCHAR));
		// 7. Skip Rows
		info->columns.AddColumn(ColumnDefinition("skip_rows", LogicalType::UINTEGER));
		// 8. Has Header
		info->columns.AddColumn(ColumnDefinition("has_header", LogicalType::BOOLEAN));
		// 9. List<Struct<Column-Name:Types>>
		info->columns.AddColumn(ColumnDefinition("columns", LogicalType::VARCHAR));
		// 10. Date Format
		info->columns.AddColumn(ColumnDefinition("date_format", LogicalType::VARCHAR));
		// 11. Timestamp Format
		info->columns.AddColumn(ColumnDefinition("timestamp_format", LogicalType::VARCHAR));
		// 12. CSV read function with all the options used
		info->columns.AddColumn(ColumnDefinition("user_arguments", LogicalType::VARCHAR));
		catalog.CreateTable(context, std::move(info));
	}
	{
		// Create Rejects Error Table
		auto info = make_uniq<CreateTableInfo>(TEMP_CATALOG, DEFAULT_SCHEMA, errors_table);
		info->temporary = true;
		info->on_conflict = OnCreateConflict::IGNORE_ON_CONFLICT;
		// 0. Scan ID
		info->columns.AddColumn(ColumnDefinition("scan_id", LogicalType::UBIGINT));
		// 1. File ID (within the scan)
		info->columns.AddColumn(ColumnDefinition("file_id", LogicalType::UBIGINT));
		// 2. Row Line
		info->columns.AddColumn(ColumnDefinition("line", LogicalType::UBIGINT));
		// 3. Byte Position of the start of the line
		info->columns.AddColumn(ColumnDefinition("line_byte_position", LogicalType::UBIGINT));
		// 4. Byte Position where error occurred
		info->columns.AddColumn(ColumnDefinition("byte_position", LogicalType::UBIGINT));
		// 5. Column Index (If Applicable)
		info->columns.AddColumn(ColumnDefinition("column_idx", LogicalType::UBIGINT));
		// 6. Column Name (If Applicable)
		info->columns.AddColumn(ColumnDefinition("column_name", LogicalType::VARCHAR));
		// 7. Error Type
		info->columns.AddColumn(ColumnDefinition("error_type", enum_type));
		// 8. Original CSV Line
		info->columns.AddColumn(ColumnDefinition("csv_line", LogicalType::VARCHAR));
		// 9. Full Error Message
		info->columns.AddColumn(ColumnDefinition("error_message", LogicalType::VARCHAR));
		catalog.CreateTable(context, std::move(info));
	}

	count = 0;
}